

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_verify_s128_256
               (mzd_local_t *out,mzd_local_t *in,view_t *view,rvec_t *rvec,mzd_local_t *mask_a,
               mzd_local_t *mask_b,mzd_local_t *mask_c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  bool bVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long in_RCX;
  undefined1 (*in_RDX) [16];
  long in_RSI;
  long lVar35;
  long in_RDI;
  undefined1 (*in_R8) [16];
  undefined1 (*in_R9) [16];
  __m128i total_carry_6;
  uint j_2;
  uint m_3;
  word128 tmp2_2 [2];
  word128 tmp1_2 [2];
  __m128i carry_5;
  __m128i total_carry_5;
  __m128i carry_4;
  __m128i total_carry_4;
  uint j_1;
  uint m_2;
  word128 tmp2_1 [2];
  word128 tmp1_1 [2];
  uint j;
  uint m_1;
  word128 tmp2 [2];
  word128 tmp1 [2];
  __m128i carry_3;
  __m128i total_carry_3;
  __m128i carry_2;
  __m128i total_carry_2;
  __m128i carry_1;
  __m128i total_carry_1;
  __m128i carry;
  __m128i total_carry;
  uint m;
  word128 bitm_c [2];
  word128 bitm_b [2];
  word128 bitm_a [2];
  word128 tmp [2];
  word128 x2m [2] [2];
  word128 x1s [2] [2];
  word128 x0s [2] [2];
  word128 r2m [2] [2];
  word128 r1s [2] [2];
  word128 r1m [2] [2];
  word128 r0s [2] [2];
  word128 r0m [2] [2];
  undefined8 local_1e48;
  undefined8 uStack_1e40;
  undefined8 local_1e38;
  undefined8 uStack_1e30;
  undefined8 local_1e28;
  undefined8 uStack_1e20;
  undefined8 local_1e18;
  undefined8 uStack_1e10;
  uint local_1dfc;
  undefined8 local_1df8;
  undefined8 uStack_1df0;
  undefined8 local_1de8;
  undefined8 uStack_1de0;
  undefined8 local_1dd8;
  undefined8 uStack_1dd0;
  undefined8 local_1dc8;
  undefined8 uStack_1dc0;
  undefined1 local_1da8 [16];
  undefined1 local_1d98 [16];
  ulong local_1d88;
  ulong uStack_1d80;
  undefined1 local_1d78 [16];
  undefined8 local_1d68;
  undefined8 uStack_1d60;
  undefined8 local_1d58;
  undefined8 uStack_1d50;
  undefined8 local_1d48;
  undefined8 uStack_1d40;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined1 local_1d18 [16];
  undefined1 local_1d08 [16];
  ulong local_1cf8;
  ulong uStack_1cf0;
  undefined1 local_1ce8 [16];
  ulong local_1cc8;
  ulong uStack_1cc0;
  undefined1 local_1cb8 [16];
  ulong local_1ca8;
  ulong uStack_1ca0;
  undefined1 local_1c98 [16];
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined8 uStack_1c50;
  undefined8 local_1c48;
  undefined8 uStack_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  uint local_1bfc;
  undefined1 local_1bf8 [32];
  undefined1 local_1bd8 [32];
  undefined1 local_1bb8 [32];
  undefined1 local_1b98 [32];
  undefined1 local_1b78 [16];
  undefined1 auStack_1b68 [16];
  undefined1 auStack_1b58 [16];
  undefined1 auStack_1b48 [16];
  undefined1 local_1b38 [16];
  undefined1 auStack_1b28 [16];
  undefined1 auStack_1b18 [16];
  undefined1 auStack_1b08 [16];
  undefined1 local_1af8 [16];
  undefined1 auStack_1ae8 [16];
  undefined1 auStack_1ad8 [16];
  undefined1 auStack_1ac8 [16];
  ulong local_1ab8 [2];
  ulong auStack_1aa8 [2];
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  ulong local_1a78;
  ulong uStack_1a70;
  ulong auStack_1a68 [4];
  ulong uStack_1a48;
  ulong uStack_1a40;
  ulong local_1a38 [2];
  ulong auStack_1a28 [2];
  undefined1 local_1a18 [16];
  undefined1 local_1a08 [16];
  ulong local_19f8;
  ulong uStack_19f0;
  ulong auStack_19e8 [4];
  ulong uStack_19c8;
  ulong uStack_19c0;
  ulong local_19b8 [2];
  ulong auStack_19a8 [2];
  undefined1 local_1998 [16];
  undefined1 local_1988 [16];
  long local_1940;
  undefined1 (*local_1930) [16];
  undefined1 (*local_1928) [16];
  undefined1 (*local_1920) [16];
  long local_1910;
  undefined1 (*local_1900) [16];
  undefined1 (*local_18f8) [16];
  undefined1 (*local_18f0) [16];
  long local_18e0;
  undefined1 (*local_18d0) [16];
  undefined1 (*local_18c8) [16];
  undefined1 (*local_18c0) [16];
  undefined1 (*local_18b8) [16];
  undefined1 (*local_18b0) [16];
  undefined1 (*local_18a8) [16];
  undefined1 (*local_18a0) [16];
  undefined1 (*local_1890) [16];
  undefined1 (*local_1880) [16];
  ulong *local_1870;
  undefined1 *local_1868;
  undefined1 *local_1860;
  undefined1 *local_1858;
  undefined1 *local_1850;
  ulong *local_1848;
  undefined1 *local_1840;
  undefined1 *local_1838;
  undefined1 *local_1830;
  undefined1 *local_1828;
  undefined1 *local_1820;
  ulong *local_1818;
  ulong *local_1810;
  undefined1 *local_1808;
  undefined1 *local_1800;
  undefined1 *local_17f8;
  undefined1 *local_17f0;
  ulong *local_17e8;
  undefined1 *local_17e0;
  undefined1 *local_17d8;
  undefined1 *local_17d0;
  undefined1 *local_17c8;
  undefined1 *local_17c0;
  ulong *local_17b8;
  ulong *local_17b0;
  ulong *local_17a8;
  undefined1 *local_17a0;
  undefined1 *local_1798;
  undefined1 *local_1790;
  ulong *local_1788;
  undefined1 *local_1780;
  undefined1 *local_1778;
  ulong *local_1770;
  undefined1 *local_1768;
  undefined1 *local_1760;
  ulong *local_1758;
  undefined1 *local_1750;
  undefined1 *local_1748;
  undefined1 (*local_1740) [16];
  undefined1 *local_1738;
  undefined1 *local_1730;
  undefined1 (*local_1728) [16];
  undefined1 *local_1720;
  undefined1 *local_1718;
  undefined1 (*local_1710) [16];
  undefined1 *local_1708;
  undefined1 *local_1700;
  undefined1 (*local_16f8) [16];
  undefined1 *local_16f0;
  undefined1 *local_16e8;
  undefined1 (*local_16e0) [16];
  undefined1 *local_16d8;
  undefined1 *local_16d0;
  undefined1 (*local_16c8) [16];
  undefined4 local_16bc;
  ulong local_16b8;
  ulong uStack_16b0;
  undefined4 local_169c;
  ulong local_1698;
  ulong uStack_1690;
  undefined4 local_167c;
  ulong local_1678;
  undefined8 uStack_1670;
  undefined4 local_165c;
  ulong local_1658;
  ulong uStack_1650;
  undefined4 local_163c;
  undefined1 local_1638 [16];
  undefined4 local_161c;
  undefined1 local_1618 [16];
  undefined4 local_15fc;
  undefined1 local_15f8 [16];
  undefined4 local_15dc;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined4 local_15bc;
  ulong local_15b8;
  ulong uStack_15b0;
  undefined4 local_159c;
  undefined1 local_1598 [16];
  undefined4 local_157c;
  undefined1 local_1578 [16];
  undefined4 local_155c;
  undefined1 local_1558 [16];
  undefined4 local_153c;
  undefined8 local_1538;
  undefined8 uStack_1530;
  undefined4 local_151c;
  ulong local_1518;
  ulong uStack_1510;
  undefined4 local_14fc;
  undefined1 local_14f8 [16];
  undefined4 local_14dc;
  undefined1 local_14d8 [16];
  undefined4 local_14bc;
  undefined1 local_14b8 [16];
  undefined4 local_149c;
  undefined1 local_1498 [16];
  undefined4 local_147c;
  undefined1 local_1478 [16];
  undefined4 local_145c;
  undefined1 local_1458 [16];
  undefined4 local_143c;
  undefined1 local_1438 [16];
  undefined4 local_141c;
  undefined1 local_1418 [16];
  undefined4 local_13fc;
  undefined1 local_13f8 [16];
  undefined4 local_13dc;
  undefined1 local_13d8 [16];
  undefined4 local_13bc;
  undefined1 local_13b8 [16];
  undefined4 local_139c;
  undefined1 local_1398 [16];
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined8 local_1378;
  undefined8 uStack_1370;
  undefined8 local_1368;
  undefined8 uStack_1360;
  undefined1 local_1358 [16];
  undefined8 local_1348;
  undefined8 uStack_1340;
  undefined1 local_1338 [16];
  undefined8 local_1328;
  undefined8 uStack_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  undefined8 local_1308;
  undefined8 uStack_1300;
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [16];
  undefined8 local_12c8;
  undefined8 uStack_12c0;
  undefined8 local_12b8;
  undefined8 uStack_12b0;
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined1 local_1298 [16];
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined1 local_1278 [16];
  undefined8 local_1268;
  undefined8 uStack_1260;
  ulong local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined1 local_1238 [16];
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined1 local_1218 [16];
  undefined8 local_1208;
  undefined8 uStack_1200;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  undefined8 uStack_11e0;
  undefined1 local_11d8 [16];
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined1 local_11b8 [16];
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  ulong local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  undefined1 local_1178 [16];
  undefined8 local_1168;
  undefined8 uStack_1160;
  undefined1 local_1158 [16];
  undefined8 local_1148;
  undefined8 uStack_1140;
  ulong local_1138;
  ulong uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [16];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined1 local_10f8 [16];
  undefined8 local_10e8;
  undefined8 uStack_10e0;
  ulong local_10d8;
  ulong uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined1 local_10b8 [16];
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined1 local_1098 [16];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined1 local_1058 [16];
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined1 local_1038 [16];
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined1 local_ff8 [16];
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  undefined1 local_fd8 [16];
  undefined4 local_fbc;
  undefined1 local_fb8 [16];
  undefined4 local_f9c;
  undefined1 local_f98 [16];
  undefined4 local_f7c;
  undefined1 local_f78 [16];
  undefined4 local_f5c;
  undefined1 local_f58 [16];
  undefined4 local_f3c;
  undefined1 local_f38 [16];
  undefined4 local_f1c;
  undefined1 local_f18 [16];
  undefined4 local_efc;
  undefined8 local_ef8;
  undefined8 uStack_ef0;
  undefined4 local_edc;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined4 local_ebc;
  undefined1 local_eb8 [16];
  undefined4 local_e9c;
  undefined1 local_e98 [16];
  undefined4 local_e7c;
  undefined1 local_e78 [16];
  undefined4 local_e5c;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined4 local_e3c;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined4 local_e1c;
  undefined1 local_e18 [16];
  undefined4 local_dfc;
  undefined1 local_df8 [16];
  undefined4 local_ddc;
  undefined1 local_dd8 [16];
  undefined4 local_dbc;
  ulong local_db8;
  ulong uStack_db0;
  undefined4 local_d9c;
  ulong local_d98;
  ulong uStack_d90;
  undefined4 local_d7c;
  ulong local_d78;
  ulong uStack_d70;
  undefined4 local_d5c;
  ulong local_d58;
  ulong uStack_d50;
  undefined4 local_d3c;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined4 local_d1c;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined4 local_cfc;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined4 local_cdc;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  ulong *local_cc0;
  ulong *local_cb8;
  ulong *local_cb0;
  ulong *local_ca8;
  ulong *local_ca0;
  ulong *local_c98;
  ulong *local_c90;
  ulong *local_c88;
  ulong *local_c80;
  ulong *local_c78;
  ulong *local_c70;
  ulong *local_c68;
  ulong *local_c60;
  ulong *local_c58;
  ulong *local_c50;
  ulong *local_c48;
  ulong *local_c40;
  ulong *local_c38;
  ulong *local_c30;
  ulong *local_c28;
  ulong *local_c20;
  undefined1 *local_c18;
  ulong *local_c10;
  undefined1 *local_c08;
  undefined1 *local_c00;
  ulong *local_bf8;
  ulong *local_bf0;
  ulong *local_be8;
  ulong *local_be0;
  undefined1 *local_bd8;
  ulong *local_bd0;
  ulong *local_bc8;
  ulong *local_bc0;
  undefined1 *local_bb8;
  ulong *local_bb0;
  ulong *local_ba8;
  undefined1 *local_ba0;
  ulong *local_b98;
  undefined1 *local_b90;
  undefined1 *local_b88;
  ulong *local_b80;
  ulong *local_b78;
  ulong *local_b70;
  ulong *local_b68;
  undefined1 *local_b60;
  ulong *local_b58;
  ulong *local_b50;
  ulong *local_b48;
  undefined1 *local_b40;
  ulong *local_b38;
  ulong *local_b30;
  ulong *local_b28;
  ulong *local_b20;
  ulong *local_b18;
  undefined1 *local_b10;
  ulong *local_b08;
  ulong *local_b00;
  ulong *local_af8;
  ulong *local_af0;
  ulong *local_ae8;
  ulong *local_ae0;
  ulong *local_ad8;
  ulong *local_ad0;
  ulong local_ac8;
  ulong uStack_ac0;
  ulong *local_ab0;
  ulong local_aa8;
  ulong uStack_aa0;
  ulong *local_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined1 (*local_a70) [16];
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined1 (*local_a30) [16];
  undefined8 local_a28;
  undefined8 uStack_a20;
  ulong local_a08;
  ulong uStack_a00;
  undefined1 (*local_9f0) [16];
  ulong local_9e8;
  ulong uStack_9e0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  __m128i carry_9;
  __m128i total_carry_9;
  __m128i carry_8;
  __m128i total_carry_8;
  uint m_4;
  __m128i carry_7;
  __m128i total_carry_7;
  __m128i carry_6;
  
  local_9a8 = *(undefined8 *)*in_R8;
  auVar11 = *in_R8;
  auVar2 = *in_R8;
  local_1880 = in_R8 + 1;
  local_9c8 = *(undefined8 *)*local_1880;
  uStack_9c0 = *(undefined8 *)(in_R8[1] + 8);
  auVar23 = *local_1880;
  auVar3 = *local_1880;
  auVar24 = *in_R9;
  auVar4 = *in_R9;
  local_1890 = in_R9 + 1;
  auVar25 = *local_1890;
  auVar6 = *local_1890;
  auVar26 = *(undefined1 (*) [16])total_carry_6[1];
  auVar9 = *(undefined1 (*) [16])total_carry_6[1];
  local_18a0 = (undefined1 (*) [16])(total_carry_6[1] + 0x10);
  auVar27 = *local_18a0;
  auVar10 = *local_18a0;
  for (local_1bfc = 0; local_1bfc < 2; local_1bfc = local_1bfc + 1) {
    local_18a8 = (undefined1 (*) [16])(in_RSI + (ulong)local_1bfc * 0x20);
    auVar14 = *local_18a8;
    auVar12 = *local_18a8;
    lVar31 = in_RSI + (ulong)local_1bfc * 0x20;
    local_18b0 = (undefined1 (*) [16])(lVar31 + 0x10);
    local_9b8 = *(undefined8 *)*local_18b0;
    uStack_9b0 = *(undefined8 *)(lVar31 + 0x18);
    auVar15 = *local_18b0;
    auVar13 = *local_18b0;
    auVar5 = *local_18b0;
    local_16c8 = (undefined1 (*) [16])(local_1af8 + (ulong)local_1bfc * 0x20);
    local_16d0 = local_1b98;
    local_16d8 = local_1bb8;
    auVar1 = vpand_avx(*local_18a8,auVar2);
    *(undefined1 (*) [16])(local_1af8 + (ulong)local_1bfc * 0x20) = auVar1;
    auVar1 = vpand_avx(auVar5,auVar3);
    *(undefined1 (*) [16])(auStack_1ae8 + (ulong)local_1bfc * 0x20) = auVar1;
    local_16e0 = (undefined1 (*) [16])(local_1b38 + (ulong)local_1bfc * 0x20);
    local_16e8 = local_1b98;
    local_16f0 = local_1bd8;
    auVar1 = vpand_avx(auVar12,auVar4);
    *(undefined1 (*) [16])(local_1b38 + (ulong)local_1bfc * 0x20) = auVar1;
    auVar1 = vpand_avx(auVar13,auVar6);
    *(undefined1 (*) [16])(auStack_1b28 + (ulong)local_1bfc * 0x20) = auVar1;
    local_16f8 = (undefined1 (*) [16])(local_1b78 + (ulong)local_1bfc * 0x20);
    local_1700 = local_1b98;
    local_1708 = local_1bf8;
    auVar1 = vpand_avx(auVar14,auVar9);
    *(undefined1 (*) [16])(local_1b78 + (ulong)local_1bfc * 0x20) = auVar1;
    auVar1 = vpand_avx(auVar15,auVar10);
    *(undefined1 (*) [16])(auStack_1b68 + (ulong)local_1bfc * 0x20) = auVar1;
    local_1398 = vpsrldq_avx(*(undefined1 (*) [16])(local_1af8 + (ulong)local_1bfc * 0x20),8);
    local_139c = 0x3e;
    auVar5 = vpsrlq_avx(local_1398,ZEXT416(0x3e));
    local_13b8 = vpslldq_avx(*(undefined1 (*) [16])(local_1af8 + (ulong)local_1bfc * 0x20),8);
    local_13bc = 0x3e;
    auVar1 = vpsrlq_avx(local_13b8,ZEXT416(0x3e));
    local_cd8 = *(undefined8 *)(local_1af8 + (ulong)local_1bfc * 0x20);
    uStack_cd0 = *(undefined8 *)(local_1af8 + (ulong)local_1bfc * 0x20 + 8);
    local_cdc = 2;
    auVar22._8_8_ = *(undefined8 *)(local_1af8 + (ulong)local_1bfc * 0x20 + 8);
    auVar22._0_8_ = *(undefined8 *)(local_1af8 + (ulong)local_1bfc * 0x20);
    local_fd8 = vpsllq_avx(auVar22,ZEXT416(2));
    local_1c28 = auVar1._0_8_;
    uStack_1c20 = auVar1._8_8_;
    local_fe8 = local_1c28;
    uStack_fe0 = uStack_1c20;
    auVar1 = vpor_avx(local_fd8,auVar1);
    *(undefined1 (*) [16])(local_1af8 + (ulong)local_1bfc * 0x20) = auVar1;
    local_13d8 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1ae8 + (ulong)local_1bfc * 0x20),8);
    local_13dc = 0x3e;
    auVar1 = vpsrlq_avx(local_13d8,ZEXT416(0x3e));
    local_cf8 = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20);
    uStack_cf0 = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20 + 8);
    local_cfc = 2;
    auVar21._8_8_ = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20 + 8);
    auVar21._0_8_ = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20);
    local_ff8 = vpsllq_avx(auVar21,ZEXT416(2));
    local_1c28 = auVar1._0_8_;
    uStack_1c20 = auVar1._8_8_;
    local_1008 = local_1c28;
    uStack_1000 = uStack_1c20;
    auVar1 = vpor_avx(local_ff8,auVar1);
    *(undefined1 (*) [16])(auStack_1ae8 + (ulong)local_1bfc * 0x20) = auVar1;
    local_1c18 = auVar5._0_8_;
    uStack_1c10 = auVar5._8_8_;
    local_1018 = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20);
    uStack_1010 = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20 + 8);
    local_1028 = local_1c18;
    uStack_1020 = uStack_1c10;
    auVar14._8_8_ = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20 + 8);
    auVar14._0_8_ = *(undefined8 *)(auStack_1ae8 + (ulong)local_1bfc * 0x20);
    auVar1 = vpor_avx(auVar14,auVar5);
    *(undefined1 (*) [16])(auStack_1ae8 + (ulong)local_1bfc * 0x20) = auVar1;
    local_13f8 = vpsrldq_avx(*(undefined1 (*) [16])(local_1b38 + (ulong)local_1bfc * 0x20),8);
    local_13fc = 0x3f;
    auVar5 = vpsrlq_avx(local_13f8,ZEXT416(0x3f));
    local_1418 = vpslldq_avx(*(undefined1 (*) [16])(local_1b38 + (ulong)local_1bfc * 0x20),8);
    local_141c = 0x3f;
    auVar1 = vpsrlq_avx(local_1418,ZEXT416(0x3f));
    local_d18 = *(undefined8 *)(local_1b38 + (ulong)local_1bfc * 0x20);
    uStack_d10 = *(undefined8 *)(local_1b38 + (ulong)local_1bfc * 0x20 + 8);
    local_d1c = 1;
    auVar20._8_8_ = *(undefined8 *)(local_1b38 + (ulong)local_1bfc * 0x20 + 8);
    auVar20._0_8_ = *(undefined8 *)(local_1b38 + (ulong)local_1bfc * 0x20);
    local_1038 = vpsllq_avx(auVar20,ZEXT416(1));
    local_1c48 = auVar1._0_8_;
    uStack_1c40 = auVar1._8_8_;
    local_1048 = local_1c48;
    uStack_1040 = uStack_1c40;
    auVar1 = vpor_avx(local_1038,auVar1);
    *(undefined1 (*) [16])(local_1b38 + (ulong)local_1bfc * 0x20) = auVar1;
    local_1438 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1b28 + (ulong)local_1bfc * 0x20),8);
    local_143c = 0x3f;
    auVar1 = vpsrlq_avx(local_1438,ZEXT416(0x3f));
    local_d38 = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20);
    uStack_d30 = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20 + 8);
    local_d3c = 1;
    auVar19._8_8_ = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20 + 8);
    auVar19._0_8_ = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20);
    local_1058 = vpsllq_avx(auVar19,ZEXT416(1));
    local_1c48 = auVar1._0_8_;
    uStack_1c40 = auVar1._8_8_;
    local_1068 = local_1c48;
    uStack_1060 = uStack_1c40;
    auVar1 = vpor_avx(local_1058,auVar1);
    *(undefined1 (*) [16])(auStack_1b28 + (ulong)local_1bfc * 0x20) = auVar1;
    local_1c38 = auVar5._0_8_;
    uStack_1c30 = auVar5._8_8_;
    local_1078 = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20);
    uStack_1070 = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20 + 8);
    local_1088 = local_1c38;
    uStack_1080 = uStack_1c30;
    auVar13._8_8_ = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20 + 8);
    auVar13._0_8_ = *(undefined8 *)(auStack_1b28 + (ulong)local_1bfc * 0x20);
    auVar1 = vpor_avx(auVar13,auVar5);
    *(undefined1 (*) [16])(auStack_1b28 + (ulong)local_1bfc * 0x20) = auVar1;
    local_18b8 = (undefined1 (*) [16])(in_RCX + (ulong)local_1bfc * 0x20);
    auVar14 = *local_18b8;
    auVar12 = *local_18b8;
    local_18c0 = (undefined1 (*) [16])(in_RCX + (ulong)local_1bfc * 0x20 + 0x10);
    auVar15 = *local_18c0;
    auVar13 = *local_18c0;
    auVar5 = *local_18c0;
    local_1710 = (undefined1 (*) [16])(local_19b8 + (ulong)local_1bfc * 4);
    local_1718 = local_1b98;
    local_1720 = local_1bb8;
    auVar1 = vpand_avx(*local_18b8,auVar11);
    *(undefined1 (*) [16])(local_19b8 + (ulong)local_1bfc * 4) = auVar1;
    auVar1 = vpand_avx(auVar5,auVar23);
    *(undefined1 (*) [16])(auStack_19a8 + (ulong)local_1bfc * 4) = auVar1;
    local_1728 = (undefined1 (*) [16])(local_1a38 + (ulong)local_1bfc * 4);
    local_1730 = local_1b98;
    local_1738 = local_1bd8;
    auVar1 = vpand_avx(auVar12,auVar24);
    *(undefined1 (*) [16])(local_1a38 + (ulong)local_1bfc * 4) = auVar1;
    auVar1 = vpand_avx(auVar13,auVar25);
    *(undefined1 (*) [16])(auStack_1a28 + (ulong)local_1bfc * 4) = auVar1;
    local_1740 = (undefined1 (*) [16])(local_1ab8 + (ulong)local_1bfc * 4);
    local_1748 = local_1b98;
    local_1750 = local_1bf8;
    auVar1 = vpand_avx(auVar14,auVar26);
    *(undefined1 (*) [16])(local_1ab8 + (ulong)local_1bfc * 4) = auVar1;
    auVar1 = vpand_avx(auVar15,auVar27);
    *(undefined1 (*) [16])(auStack_1aa8 + (ulong)local_1bfc * 4) = auVar1;
    local_1458 = vpsrldq_avx(*(undefined1 (*) [16])(local_19b8 + (ulong)local_1bfc * 4),8);
    local_145c = 0x3e;
    auVar5 = vpsrlq_avx(local_1458,ZEXT416(0x3e));
    local_1478 = vpslldq_avx(*(undefined1 (*) [16])(local_19b8 + (ulong)local_1bfc * 4),8);
    local_147c = 0x3e;
    auVar1 = vpsrlq_avx(local_1478,ZEXT416(0x3e));
    local_d58 = local_19b8[(ulong)local_1bfc * 4];
    uStack_d50 = auStack_19a8[(ulong)local_1bfc * 4 + -1];
    local_d5c = 2;
    auVar18._8_8_ = auStack_19a8[(ulong)local_1bfc * 4 + -1];
    auVar18._0_8_ = local_19b8[(ulong)local_1bfc * 4];
    local_1098 = vpsllq_avx(auVar18,ZEXT416(2));
    local_1c68 = auVar1._0_8_;
    uStack_1c60 = auVar1._8_8_;
    local_10a8 = local_1c68;
    uStack_10a0 = uStack_1c60;
    auVar1 = vpor_avx(local_1098,auVar1);
    *(undefined1 (*) [16])(&local_19f8 + (ulong)local_1bfc * 4) = auVar1;
    local_1498 = vpslldq_avx(*(undefined1 (*) [16])(auStack_19a8 + (ulong)local_1bfc * 4),8);
    local_149c = 0x3e;
    auVar1 = vpsrlq_avx(local_1498,ZEXT416(0x3e));
    local_d78 = auStack_19a8[(ulong)local_1bfc * 4];
    uStack_d70 = auStack_19a8[(ulong)local_1bfc * 4 + 1];
    local_d7c = 2;
    auVar17._8_8_ = auStack_19a8[(ulong)local_1bfc * 4 + 1];
    auVar17._0_8_ = auStack_19a8[(ulong)local_1bfc * 4];
    local_10b8 = vpsllq_avx(auVar17,ZEXT416(2));
    local_1c68 = auVar1._0_8_;
    uStack_1c60 = auVar1._8_8_;
    local_10c8 = local_1c68;
    uStack_10c0 = uStack_1c60;
    auVar1 = vpor_avx(local_10b8,auVar1);
    *(undefined1 (*) [16])(auStack_19e8 + (ulong)local_1bfc * 4) = auVar1;
    local_1c58 = auVar5._0_8_;
    uStack_1c50 = auVar5._8_8_;
    local_10d8 = auStack_19e8[(ulong)local_1bfc * 4];
    uStack_10d0 = auStack_19e8[(ulong)local_1bfc * 4 + 1];
    local_10e8 = local_1c58;
    uStack_10e0 = uStack_1c50;
    auVar12._8_8_ = auStack_19e8[(ulong)local_1bfc * 4 + 1];
    auVar12._0_8_ = auStack_19e8[(ulong)local_1bfc * 4];
    auVar1 = vpor_avx(auVar12,auVar5);
    *(undefined1 (*) [16])(auStack_19e8 + (ulong)local_1bfc * 4) = auVar1;
    local_14b8 = vpsrldq_avx(*(undefined1 (*) [16])(local_1a38 + (ulong)local_1bfc * 4),8);
    local_14bc = 0x3f;
    auVar5 = vpsrlq_avx(local_14b8,ZEXT416(0x3f));
    local_14d8 = vpslldq_avx(*(undefined1 (*) [16])(local_1a38 + (ulong)local_1bfc * 4),8);
    local_14dc = 0x3f;
    auVar1 = vpsrlq_avx(local_14d8,ZEXT416(0x3f));
    local_d98 = local_1a38[(ulong)local_1bfc * 4];
    uStack_d90 = auStack_1a28[(ulong)local_1bfc * 4 + -1];
    local_d9c = 1;
    auVar16._8_8_ = auStack_1a28[(ulong)local_1bfc * 4 + -1];
    auVar16._0_8_ = local_1a38[(ulong)local_1bfc * 4];
    local_10f8 = vpsllq_avx(auVar16,ZEXT416(1));
    local_1c88 = auVar1._0_8_;
    uStack_1c80 = auVar1._8_8_;
    local_1108 = local_1c88;
    uStack_1100 = uStack_1c80;
    auVar1 = vpor_avx(local_10f8,auVar1);
    *(undefined1 (*) [16])(&local_1a78 + (ulong)local_1bfc * 4) = auVar1;
    local_14f8 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1a28 + (ulong)local_1bfc * 4),8);
    local_14fc = 0x3f;
    auVar1 = vpsrlq_avx(local_14f8,ZEXT416(0x3f));
    local_db8 = auStack_1a28[(ulong)local_1bfc * 4];
    uStack_db0 = auStack_1a28[(ulong)local_1bfc * 4 + 1];
    local_dbc = 1;
    auVar15._8_8_ = auStack_1a28[(ulong)local_1bfc * 4 + 1];
    auVar15._0_8_ = auStack_1a28[(ulong)local_1bfc * 4];
    local_1118 = vpsllq_avx(auVar15,ZEXT416(1));
    local_1c88 = auVar1._0_8_;
    uStack_1c80 = auVar1._8_8_;
    local_1128 = local_1c88;
    uStack_1120 = uStack_1c80;
    auVar1 = vpor_avx(local_1118,auVar1);
    *(undefined1 (*) [16])(auStack_1a68 + (ulong)local_1bfc * 4) = auVar1;
    local_1c78 = auVar5._0_8_;
    uStack_1c70 = auVar5._8_8_;
    local_1138 = auStack_1a68[(ulong)local_1bfc * 4];
    uStack_1130 = auStack_1a68[(ulong)local_1bfc * 4 + 1];
    local_1148 = local_1c78;
    uStack_1140 = uStack_1c70;
    auVar1._8_8_ = auStack_1a68[(ulong)local_1bfc * 4 + 1];
    auVar1._0_8_ = auStack_1a68[(ulong)local_1bfc * 4];
    auVar1 = vpor_avx(auVar1,auVar5);
    *(undefined1 (*) [16])(auStack_1a68 + (ulong)local_1bfc * 4) = auVar1;
  }
  bVar28 = false;
  while (!bVar28) {
    local_1758 = &local_1ca8;
    local_1760 = local_1af8;
    local_1768 = local_1b38;
    auVar2 = vpand_avx(local_1af8,local_1b38);
    vpand_avx(auStack_1ae8,auStack_1b28);
    local_1770 = &local_1cc8;
    local_1778 = auStack_1ad8;
    local_1780 = local_1b38;
    auVar3 = vpand_avx(auStack_1ad8,local_1b38);
    vpand_avx(auStack_1ac8,auStack_1b28);
    local_ad0 = local_19b8;
    local_ad8 = &local_1ca8;
    local_ae0 = &local_1cc8;
    local_1ca8 = auVar2._0_8_;
    uStack_1ca0 = auVar2._8_8_;
    local_1cc8 = auVar3._0_8_;
    uStack_1cc0 = auVar3._8_8_;
    local_1cc8 = local_1ca8 ^ local_1cc8;
    uStack_1cc0 = uStack_1ca0 ^ uStack_1cc0;
    uVar29 = local_1cb8._0_8_;
    uVar30 = local_1cb8._8_8_;
    local_1788 = &local_1ca8;
    local_1790 = local_1af8;
    local_1798 = auStack_1b18;
    auVar2 = vpand_avx(local_1af8,auStack_1b18);
    local_1c98 = vpand_avx(auStack_1ae8,auStack_1b08);
    local_ae8 = local_19b8;
    local_af0 = local_19b8;
    local_af8 = &local_1ca8;
    local_1ca8 = auVar2._0_8_;
    uStack_1ca0 = auVar2._8_8_;
    local_b00 = &local_1cc8;
    local_b08 = local_1ab8;
    local_b10 = local_1a98;
    local_1cb8._8_8_ = auStack_1aa8[1] ^ local_1a88._8_8_;
    local_1cb8._0_8_ = auStack_1aa8[0] ^ local_1a88._0_8_;
    local_b18 = local_19b8;
    local_b20 = local_19b8;
    local_b28 = &local_1cc8;
    local_19b8[0] = local_1cc8 ^ local_1ca8 ^ local_1ab8[0] ^ local_1a98._0_8_;
    local_19b8[1] = uStack_1cc0 ^ uStack_1ca0 ^ local_1ab8[1] ^ local_1a98._8_8_;
    local_a08 = uVar29 ^ auStack_1aa8[0] ^ local_1a88._0_8_;
    uStack_a00 = uVar30 ^ auStack_1aa8[1] ^ local_1a88._8_8_;
    local_9e8 = local_19b8[0];
    uStack_9e0 = local_19b8[1];
    *(ulong *)*in_RDX = local_19b8[0];
    *(ulong *)(*in_RDX + 8) = local_19b8[1];
    local_9f0 = in_RDX + 1;
    *(ulong *)in_RDX[1] = local_a08;
    *(ulong *)(in_RDX[1] + 8) = uStack_a00;
    bVar28 = true;
  }
  local_18c8 = in_RDX + 2;
  local_18d0 = in_RDX + 3;
  local_18e0 = total_carry_6[1] + 0x10;
  local_17a0 = local_1998;
  local_17a8 = &local_1cc8;
  local_17b0 = &local_1ca8;
  local_1998 = vpand_avx(in_RDX[2],*(undefined1 (*) [16])total_carry_6[1]);
  local_1988 = vpand_avx(local_1cb8,local_1c98);
  bVar28 = false;
  while (auVar2 = local_1d08, !bVar28) {
    local_17b8 = &local_1cf8;
    local_17c0 = local_1b38;
    local_17c8 = local_1b78;
    auVar2 = vpand_avx(local_1b38,local_1b78);
    vpand_avx(auStack_1b28,auStack_1b68);
    local_17d0 = local_1d18;
    local_17d8 = auStack_1b18;
    local_17e0 = local_1b78;
    local_1d18 = vpand_avx(auStack_1b18,local_1b78);
    vpand_avx(auStack_1b08,auStack_1b68);
    local_b30 = local_1ab8;
    local_b38 = &local_1cf8;
    local_b40 = local_1d18;
    local_1cf8 = auVar2._0_8_;
    uStack_1cf0 = auVar2._8_8_;
    uVar7 = local_1cf8 ^ local_1d18._0_8_;
    uVar8 = uStack_1cf0 ^ local_1d18._8_8_;
    local_17e8 = &local_1cf8;
    local_17f0 = local_1b38;
    local_17f8 = auStack_1b58;
    auVar2 = vpand_avx(local_1b38,auStack_1b58);
    local_1ce8 = vpand_avx(auStack_1b28,auStack_1b48);
    local_b48 = local_1ab8;
    local_b50 = local_1ab8;
    local_b58 = &local_1cf8;
    local_1cf8 = auVar2._0_8_;
    uStack_1cf0 = auVar2._8_8_;
    local_b60 = local_1d18;
    local_b68 = &local_1a78;
    local_b70 = auStack_1a68 + 2;
    local_1d18._0_8_ = local_1a78 ^ auStack_1a68[2];
    local_1d18._8_8_ = uStack_1a70 ^ auStack_1a68[3];
    local_b78 = local_1ab8;
    local_b80 = local_1ab8;
    local_b88 = local_1d18;
    local_1d18._0_8_ = SUB168(local_1d18,0);
    local_1d18._8_8_ = SUB168(local_1d18,8);
    local_1ab8[0] = uVar7 ^ local_1cf8 ^ local_1d18._0_8_;
    local_1ab8[1] = uVar8 ^ uStack_1cf0 ^ local_1d18._8_8_;
    local_dd8 = vpslldq_avx(ZEXT816(0),8);
    local_ddc = 0x3f;
    auVar3 = vpsllq_avx(local_dd8,ZEXT416(0x3f));
    auVar25._8_8_ = local_1ab8[1];
    auVar25._0_8_ = local_1ab8[0];
    local_df8 = vpsrldq_avx(auVar25,8);
    local_dfc = 0x3f;
    auVar2 = vpsllq_avx(local_df8,ZEXT416(0x3f));
    auVar26._8_8_ = local_1ab8[1];
    auVar26._0_8_ = local_1ab8[0];
    local_1518 = local_1ab8[0];
    uStack_1510 = local_1ab8[1];
    local_151c = 1;
    local_1158 = vpsrlq_avx(auVar26,ZEXT416(1));
    local_1d48 = auVar2._0_8_;
    uStack_1d40 = auVar2._8_8_;
    local_1168 = local_1d48;
    uStack_1160 = uStack_1d40;
    auVar2 = vpor_avx(local_1158,auVar2);
    local_e18 = vpsrldq_avx(ZEXT816(0),8);
    local_e1c = 0x3f;
    auVar4 = vpsllq_avx(local_e18,ZEXT416(0x3f));
    local_1538 = 0;
    uStack_1530 = 0;
    local_153c = 1;
    local_1178 = vpsrlq_avx(ZEXT816(0),ZEXT416(1));
    local_1d48 = auVar4._0_8_;
    uStack_1d40 = auVar4._8_8_;
    local_1188 = local_1d48;
    uStack_1180 = uStack_1d40;
    vpor_avx(local_1178,auVar4);
    local_1cf8 = auVar2._0_8_;
    uStack_1cf0 = auVar2._8_8_;
    local_1d38 = auVar3._0_8_;
    uStack_1d30 = auVar3._8_8_;
    local_1198 = local_1cf8;
    uStack_1190 = uStack_1cf0;
    local_11a8 = local_1d38;
    uStack_11a0 = uStack_1d30;
    auVar2 = vpor_avx(auVar2,auVar3);
    local_1d18 = *in_RDX;
    local_18f0 = in_RDX + 1;
    local_1d08 = in_RDX[1];
    local_b90 = local_1d18;
    local_b98 = &local_1cf8;
    local_ba0 = local_1d18;
    local_1cf8 = auVar2._0_8_;
    uStack_1cf0 = auVar2._8_8_;
    uStack_1cf0 = uStack_1cf0 ^ local_1d18._8_8_;
    local_1d18._0_8_ = local_1cf8 ^ local_1d18._0_8_;
    local_1d18._8_8_ = uStack_1cf0;
    uVar7 = local_1ce8._0_8_ ^ auStack_1a68[0] ^ uStack_1a48;
    uVar8 = local_1ce8._8_8_ ^ auStack_1a68[1] ^ uStack_1a40;
    local_1d08._0_8_ = uVar7;
    local_1d08._8_8_ = uVar8;
    auVar2 = local_1d08;
    auVar3 = local_1d08;
    local_1d18._0_8_ = SUB168(local_1d18,0);
    local_1d18._8_8_ = SUB168(local_1d18,8);
    local_a28 = local_1d18._0_8_;
    uStack_a20 = local_1d18._8_8_;
    *(undefined8 *)*in_RDX = local_1d18._0_8_;
    *(undefined8 *)(*in_RDX + 8) = local_1d18._8_8_;
    local_1d08._0_8_ = auVar2._0_8_;
    local_1d08._8_8_ = auVar2._8_8_;
    local_a30 = in_RDX + 1;
    local_a48 = local_1d08._0_8_;
    uStack_a40 = local_1d08._8_8_;
    *(undefined8 *)in_RDX[1] = local_1d08._0_8_;
    *(undefined8 *)(in_RDX[1] + 8) = local_1d08._8_8_;
    local_1d08 = auVar3;
    bVar28 = true;
  }
  local_18f8 = in_RDX + 2;
  local_1900 = in_RDX + 3;
  local_1910 = total_carry_6[1] + 0x10;
  local_1558 = vpsrldq_avx(*local_18f8,8);
  local_155c = 0x3f;
  auVar6 = vpsrlq_avx(local_1558,ZEXT416(0x3f));
  local_1578 = vpslldq_avx(*local_18f8,8);
  local_157c = 0x3f;
  auVar3 = vpsrlq_avx(local_1578,ZEXT416(0x3f));
  local_e38 = *(undefined8 *)*local_18f8;
  uStack_e30 = *(undefined8 *)(in_RDX[2] + 8);
  local_e3c = 1;
  local_11b8 = vpsllq_avx(*local_18f8,ZEXT416(1));
  local_1d68 = auVar3._0_8_;
  uStack_1d60 = auVar3._8_8_;
  local_11c8 = local_1d68;
  uStack_11c0 = uStack_1d60;
  auVar3 = vpor_avx(local_11b8,auVar3);
  local_1598 = vpslldq_avx(*local_1900,8);
  local_159c = 0x3f;
  auVar4 = vpsrlq_avx(local_1598,ZEXT416(0x3f));
  local_e58 = *(undefined8 *)*local_1900;
  uStack_e50 = *(undefined8 *)(in_RDX[3] + 8);
  local_e5c = 1;
  local_11d8 = vpsllq_avx(*local_1900,ZEXT416(1));
  local_1d68 = auVar4._0_8_;
  uStack_1d60 = auVar4._8_8_;
  local_11e8 = local_1d68;
  uStack_11e0 = uStack_1d60;
  auVar4 = vpor_avx(local_11d8,auVar4);
  local_1d08._0_8_ = auVar4._0_8_;
  local_1d08._8_8_ = auVar4._8_8_;
  local_1d58 = auVar6._0_8_;
  uStack_1d50 = auVar6._8_8_;
  local_11f8 = local_1d08._0_8_;
  uStack_11f0 = local_1d08._8_8_;
  local_1208 = local_1d58;
  uStack_1200 = uStack_1d50;
  vpor_avx(auVar4,auVar6);
  local_1800 = local_1a98;
  local_1808 = local_1d18;
  local_1810 = &local_1cf8;
  local_1a98 = vpand_avx(auVar3,*(undefined1 (*) [16])total_carry_6[1]);
  local_1a88 = vpand_avx(auVar2,local_1ce8);
  bVar28 = false;
  while (auVar2 = local_1d98, !bVar28) {
    local_1818 = &local_1d88;
    local_1820 = local_1af8;
    local_1828 = local_1b78;
    auVar2 = vpand_avx(local_1af8,local_1b78);
    vpand_avx(auStack_1ae8,auStack_1b68);
    local_1830 = local_1da8;
    local_1838 = auStack_1ad8;
    local_1840 = local_1b78;
    local_1da8 = vpand_avx(auStack_1ad8,local_1b78);
    vpand_avx(auStack_1ac8,auStack_1b68);
    local_ba8 = local_1a38;
    local_bb0 = &local_1d88;
    local_bb8 = local_1da8;
    local_1d88 = auVar2._0_8_;
    uStack_1d80 = auVar2._8_8_;
    uVar7 = local_1d88 ^ local_1da8._0_8_;
    uVar8 = uStack_1d80 ^ local_1da8._8_8_;
    local_1848 = &local_1d88;
    local_1850 = local_1af8;
    local_1858 = auStack_1b58;
    auVar2 = vpand_avx(local_1af8,auStack_1b58);
    local_1d78 = vpand_avx(auStack_1ae8,auStack_1b48);
    local_bc0 = local_1a38;
    local_bc8 = local_1a38;
    local_bd0 = &local_1d88;
    local_1d88 = auVar2._0_8_;
    uStack_1d80 = auVar2._8_8_;
    local_bd8 = local_1da8;
    local_be0 = &local_19f8;
    local_be8 = auStack_19e8 + 2;
    local_1da8._0_8_ = local_19f8 ^ auStack_19e8[2];
    local_1da8._8_8_ = uStack_19f0 ^ auStack_19e8[3];
    local_bf0 = local_1a38;
    local_bf8 = local_1a38;
    local_c00 = local_1da8;
    local_1da8._0_8_ = SUB168(local_1da8,0);
    local_1da8._8_8_ = SUB168(local_1da8,8);
    local_1a38[0] = uVar7 ^ local_1d88 ^ local_1da8._0_8_;
    local_1a38[1] = uVar8 ^ uStack_1d80 ^ local_1da8._8_8_;
    local_e78 = vpslldq_avx(ZEXT816(0),8);
    local_e7c = 0x3e;
    auVar3 = vpsllq_avx(local_e78,ZEXT416(0x3e));
    auVar23._8_8_ = local_1a38[1];
    auVar23._0_8_ = local_1a38[0];
    local_e98 = vpsrldq_avx(auVar23,8);
    local_e9c = 0x3e;
    auVar2 = vpsllq_avx(local_e98,ZEXT416(0x3e));
    auVar24._8_8_ = local_1a38[1];
    auVar24._0_8_ = local_1a38[0];
    local_15b8 = local_1a38[0];
    uStack_15b0 = local_1a38[1];
    local_15bc = 2;
    local_1218 = vpsrlq_avx(auVar24,ZEXT416(2));
    local_1dd8 = auVar2._0_8_;
    uStack_1dd0 = auVar2._8_8_;
    local_1228 = local_1dd8;
    uStack_1220 = uStack_1dd0;
    auVar2 = vpor_avx(local_1218,auVar2);
    local_eb8 = vpsrldq_avx(ZEXT816(0),8);
    local_ebc = 0x3e;
    auVar4 = vpsllq_avx(local_eb8,ZEXT416(0x3e));
    local_15d8 = 0;
    uStack_15d0 = 0;
    local_15dc = 2;
    local_1238 = vpsrlq_avx(ZEXT816(0),ZEXT416(2));
    local_1dd8 = auVar4._0_8_;
    uStack_1dd0 = auVar4._8_8_;
    local_1248 = local_1dd8;
    uStack_1240 = uStack_1dd0;
    vpor_avx(local_1238,auVar4);
    local_1d88 = auVar2._0_8_;
    uStack_1d80 = auVar2._8_8_;
    local_1dc8 = auVar3._0_8_;
    uStack_1dc0 = auVar3._8_8_;
    local_1258 = local_1d88;
    uStack_1250 = uStack_1d80;
    local_1268 = local_1dc8;
    uStack_1260 = uStack_1dc0;
    auVar2 = vpor_avx(auVar2,auVar3);
    local_1da8 = *in_RDX;
    local_1920 = in_RDX + 1;
    local_1d98 = in_RDX[1];
    local_c08 = local_1da8;
    local_c10 = &local_1d88;
    local_c18 = local_1da8;
    local_1d88 = auVar2._0_8_;
    uStack_1d80 = auVar2._8_8_;
    uStack_1d80 = uStack_1d80 ^ local_1da8._8_8_;
    local_1da8._0_8_ = local_1d88 ^ local_1da8._0_8_;
    local_1da8._8_8_ = uStack_1d80;
    uVar7 = local_1d78._0_8_ ^ auStack_19e8[0] ^ uStack_19c8;
    uVar8 = local_1d78._8_8_ ^ auStack_19e8[1] ^ uStack_19c0;
    local_1d98._0_8_ = uVar7;
    local_1d98._8_8_ = uVar8;
    auVar2 = local_1d98;
    auVar3 = local_1d98;
    local_1da8._0_8_ = SUB168(local_1da8,0);
    local_1da8._8_8_ = SUB168(local_1da8,8);
    local_a68 = local_1da8._0_8_;
    uStack_a60 = local_1da8._8_8_;
    *(undefined8 *)*in_RDX = local_1da8._0_8_;
    *(undefined8 *)(*in_RDX + 8) = local_1da8._8_8_;
    local_1d98._0_8_ = auVar2._0_8_;
    local_1d98._8_8_ = auVar2._8_8_;
    local_a70 = in_RDX + 1;
    local_a88 = local_1d98._0_8_;
    uStack_a80 = local_1d98._8_8_;
    *(undefined8 *)in_RDX[1] = local_1d98._0_8_;
    *(undefined8 *)(in_RDX[1] + 8) = local_1d98._8_8_;
    local_1d98 = auVar3;
    bVar28 = true;
  }
  local_1928 = in_RDX + 2;
  local_1930 = in_RDX + 3;
  local_1940 = total_carry_6[1] + 0x10;
  local_15f8 = vpsrldq_avx(*local_1928,8);
  local_15fc = 0x3e;
  auVar6 = vpsrlq_avx(local_15f8,ZEXT416(0x3e));
  local_1618 = vpslldq_avx(*local_1928,8);
  local_161c = 0x3e;
  auVar3 = vpsrlq_avx(local_1618,ZEXT416(0x3e));
  local_ed8 = *(undefined8 *)*local_1928;
  uStack_ed0 = *(undefined8 *)(in_RDX[2] + 8);
  local_edc = 2;
  local_1278 = vpsllq_avx(*local_1928,ZEXT416(2));
  local_1df8 = auVar3._0_8_;
  uStack_1df0 = auVar3._8_8_;
  local_1288 = local_1df8;
  uStack_1280 = uStack_1df0;
  auVar3 = vpor_avx(local_1278,auVar3);
  local_1638 = vpslldq_avx(*local_1930,8);
  local_163c = 0x3e;
  auVar4 = vpsrlq_avx(local_1638,ZEXT416(0x3e));
  local_ef8 = *(undefined8 *)*local_1930;
  uStack_ef0 = *(undefined8 *)(in_RDX[3] + 8);
  local_efc = 2;
  local_1298 = vpsllq_avx(*local_1930,ZEXT416(2));
  local_1df8 = auVar4._0_8_;
  uStack_1df0 = auVar4._8_8_;
  local_12a8 = local_1df8;
  uStack_12a0 = uStack_1df0;
  auVar4 = vpor_avx(local_1298,auVar4);
  local_1d98._0_8_ = auVar4._0_8_;
  local_1d98._8_8_ = auVar4._8_8_;
  local_1de8 = auVar6._0_8_;
  uStack_1de0 = auVar6._8_8_;
  local_12b8 = local_1d98._0_8_;
  uStack_12b0 = local_1d98._8_8_;
  local_12c8 = local_1de8;
  uStack_12c0 = uStack_1de0;
  vpor_avx(auVar4,auVar6);
  local_1860 = local_1a18;
  local_1868 = local_1da8;
  local_1870 = &local_1d88;
  local_1a18 = vpand_avx(auVar3,*(undefined1 (*) [16])total_carry_6[1]);
  local_1a08 = vpand_avx(auVar2,local_1d78);
  for (local_1dfc = 0; local_1dfc < 2; local_1dfc = local_1dfc + 1) {
    uVar32 = (ulong)local_1dfc;
    uVar33 = (ulong)local_1dfc;
    lVar31 = (ulong)local_1dfc * 0x20;
    local_c20 = local_1ab8 + uVar32 * 4;
    local_c28 = local_1ab8 + uVar33 * 4;
    local_c30 = (ulong *)(local_1af8 + lVar31);
    uVar7 = local_1ab8[uVar33 * 4 + 1];
    uVar8 = *(ulong *)(local_1af8 + lVar31 + 8);
    local_1ab8[uVar32 * 4] = local_1ab8[uVar33 * 4] ^ *(ulong *)(local_1af8 + lVar31);
    local_1ab8[uVar32 * 4 + 1] = uVar7 ^ uVar8;
    uVar7 = *(ulong *)(local_1a98 + uVar33 * 0x20 + -8);
    uVar8 = *(ulong *)(auStack_1ae8 + lVar31 + 8);
    auStack_1aa8[uVar32 * 4] = auStack_1aa8[uVar33 * 4] ^ *(ulong *)(auStack_1ae8 + lVar31);
    *(ulong *)(local_1a98 + uVar32 * 0x20 + -8) = uVar7 ^ uVar8;
    lVar31 = (ulong)local_1dfc * 0x20;
    lVar34 = (ulong)local_1dfc * 0x20;
    lVar35 = (ulong)local_1dfc * 0x20;
    local_c38 = (ulong *)(local_1af8 + lVar31);
    local_c40 = (ulong *)(local_1af8 + lVar34);
    local_c48 = (ulong *)(local_1b38 + lVar35);
    uVar7 = *(ulong *)(local_1af8 + lVar34 + 8);
    uVar8 = *(ulong *)(local_1b38 + lVar35 + 8);
    *(ulong *)(local_1af8 + lVar31) =
         *(ulong *)(local_1af8 + lVar34) ^ *(ulong *)(local_1b38 + lVar35);
    *(ulong *)(local_1af8 + lVar31 + 8) = uVar7 ^ uVar8;
    uVar7 = *(ulong *)(auStack_1ae8 + lVar34 + 8);
    uVar8 = *(ulong *)(auStack_1b28 + lVar35 + 8);
    *(ulong *)(auStack_1ae8 + lVar31) =
         *(ulong *)(auStack_1ae8 + lVar34) ^ *(ulong *)(auStack_1b28 + lVar35);
    *(ulong *)(auStack_1ae8 + lVar31 + 8) = uVar7 ^ uVar8;
    uVar32 = (ulong)local_1dfc;
    lVar31 = (ulong)local_1dfc * 0x20;
    uVar33 = (ulong)local_1dfc;
    local_c50 = local_1a38 + uVar32 * 4;
    local_c58 = (ulong *)(local_1af8 + lVar31);
    local_c60 = local_1a38 + uVar33 * 4;
    uVar7 = *(ulong *)(local_1af8 + lVar31 + 8);
    uVar8 = auStack_1a28[uVar33 * 4 + -1];
    local_1a38[uVar32 * 4] = *(ulong *)(local_1af8 + lVar31) ^ local_1a38[uVar33 * 4];
    auStack_1a28[uVar32 * 4 + -1] = uVar7 ^ uVar8;
    uVar7 = *(ulong *)(auStack_1ae8 + lVar31 + 8);
    uVar8 = auStack_1a28[uVar33 * 4 + 1];
    auStack_1a28[uVar32 * 4] = *(ulong *)(auStack_1ae8 + lVar31) ^ auStack_1a28[uVar33 * 4];
    auStack_1a28[uVar32 * 4 + 1] = uVar7 ^ uVar8;
    uVar32 = (ulong)local_1dfc;
    lVar31 = (ulong)local_1dfc * 0x20;
    uVar33 = (ulong)local_1dfc;
    local_c68 = local_19b8 + uVar32 * 4;
    local_c70 = (ulong *)(local_1af8 + lVar31);
    local_c78 = local_19b8 + uVar33 * 4;
    uVar7 = *(ulong *)(local_1af8 + lVar31 + 8);
    uVar8 = auStack_19a8[uVar33 * 4 + -1];
    local_19b8[uVar32 * 4] = *(ulong *)(local_1af8 + lVar31) ^ local_19b8[uVar33 * 4];
    auStack_19a8[uVar32 * 4 + -1] = uVar7 ^ uVar8;
    uVar7 = *(ulong *)(auStack_1ae8 + lVar31 + 8);
    uVar8 = auStack_19a8[uVar33 * 4 + 1];
    auStack_19a8[uVar32 * 4] = *(ulong *)(auStack_1ae8 + lVar31) ^ auStack_19a8[uVar33 * 4];
    auStack_19a8[uVar32 * 4 + 1] = uVar7 ^ uVar8;
    uVar32 = (ulong)local_1dfc;
    uVar33 = (ulong)local_1dfc;
    lVar31 = (ulong)local_1dfc * 0x20;
    local_c80 = local_19b8 + uVar32 * 4;
    local_c88 = local_19b8 + uVar33 * 4;
    local_c90 = (ulong *)(local_1b78 + lVar31);
    uVar7 = auStack_19a8[uVar33 * 4 + -1];
    uVar8 = *(ulong *)(local_1b78 + lVar31 + 8);
    local_19b8[uVar32 * 4] = local_19b8[uVar33 * 4] ^ *(ulong *)(local_1b78 + lVar31);
    auStack_19a8[uVar32 * 4 + -1] = uVar7 ^ uVar8;
    uVar7 = auStack_19a8[uVar33 * 4 + 1];
    uVar8 = *(ulong *)(auStack_1b68 + lVar31 + 8);
    auStack_19a8[uVar32 * 4] = auStack_19a8[uVar33 * 4] ^ *(ulong *)(auStack_1b68 + lVar31);
    auStack_19a8[uVar32 * 4 + 1] = uVar7 ^ uVar8;
    local_f18 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1aa8 + (ulong)local_1dfc * 4),8);
    local_f1c = 0x3e;
    auVar3 = vpsllq_avx(local_f18,ZEXT416(0x3e));
    local_f38 = vpsrldq_avx(*(undefined1 (*) [16])(local_1ab8 + (ulong)local_1dfc * 4),8);
    local_f3c = 0x3e;
    auVar2 = vpsllq_avx(local_f38,ZEXT416(0x3e));
    local_1658 = local_1ab8[(ulong)local_1dfc * 4];
    uStack_1650 = local_1ab8[(ulong)local_1dfc * 4 + 1];
    local_165c = 2;
    auVar10._8_8_ = local_1ab8[(ulong)local_1dfc * 4 + 1];
    auVar10._0_8_ = local_1ab8[(ulong)local_1dfc * 4];
    local_12d8 = vpsrlq_avx(auVar10,ZEXT416(2));
    local_1e28 = auVar2._0_8_;
    uStack_1e20 = auVar2._8_8_;
    local_12e8 = local_1e28;
    uStack_12e0 = uStack_1e20;
    auVar2 = vpor_avx(local_12d8,auVar2);
    *(undefined1 (*) [16])(local_1af8 + (ulong)local_1dfc * 0x20) = auVar2;
    local_f58 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_1aa8 + (ulong)local_1dfc * 4),8);
    local_f5c = 0x3e;
    auVar2 = vpsllq_avx(local_f58,ZEXT416(0x3e));
    local_1678 = auStack_1aa8[(ulong)local_1dfc * 4];
    uStack_1670 = *(undefined8 *)(local_1a98 + (ulong)local_1dfc * 0x20 + -8);
    local_167c = 2;
    auVar9._8_8_ = *(undefined8 *)(local_1a98 + (ulong)local_1dfc * 0x20 + -8);
    auVar9._0_8_ = auStack_1aa8[(ulong)local_1dfc * 4];
    local_12f8 = vpsrlq_avx(auVar9,ZEXT416(2));
    local_1e28 = auVar2._0_8_;
    uStack_1e20 = auVar2._8_8_;
    local_1308 = local_1e28;
    uStack_1300 = uStack_1e20;
    auVar2 = vpor_avx(local_12f8,auVar2);
    *(undefined1 (*) [16])(auStack_1ae8 + (ulong)local_1dfc * 0x20) = auVar2;
    local_1e18 = auVar3._0_8_;
    uStack_1e10 = auVar3._8_8_;
    local_1318 = *(undefined8 *)(local_1af8 + (ulong)local_1dfc * 0x20);
    uStack_1310 = *(undefined8 *)(local_1af8 + (ulong)local_1dfc * 0x20 + 8);
    local_1328 = local_1e18;
    uStack_1320 = uStack_1e10;
    auVar11._8_8_ = *(undefined8 *)(local_1af8 + (ulong)local_1dfc * 0x20 + 8);
    auVar11._0_8_ = *(undefined8 *)(local_1af8 + (ulong)local_1dfc * 0x20);
    auVar2 = vpor_avx(auVar11,auVar3);
    *(undefined1 (*) [16])(local_1af8 + (ulong)local_1dfc * 0x20) = auVar2;
    local_f78 = vpslldq_avx(*(undefined1 (*) [16])(auStack_1a28 + (ulong)local_1dfc * 4),8);
    local_f7c = 0x3f;
    auVar3 = vpsllq_avx(local_f78,ZEXT416(0x3f));
    local_f98 = vpsrldq_avx(*(undefined1 (*) [16])(local_1a38 + (ulong)local_1dfc * 4),8);
    local_f9c = 0x3f;
    auVar2 = vpsllq_avx(local_f98,ZEXT416(0x3f));
    local_1698 = local_1a38[(ulong)local_1dfc * 4];
    uStack_1690 = auStack_1a28[(ulong)local_1dfc * 4 + -1];
    local_169c = 1;
    auVar6._8_8_ = auStack_1a28[(ulong)local_1dfc * 4 + -1];
    auVar6._0_8_ = local_1a38[(ulong)local_1dfc * 4];
    local_1338 = vpsrlq_avx(auVar6,ZEXT416(1));
    local_1e48 = auVar2._0_8_;
    uStack_1e40 = auVar2._8_8_;
    local_1348 = local_1e48;
    uStack_1340 = uStack_1e40;
    auVar2 = vpor_avx(local_1338,auVar2);
    *(undefined1 (*) [16])(local_1b38 + (ulong)local_1dfc * 0x20) = auVar2;
    local_fb8 = vpsrldq_avx(*(undefined1 (*) [16])(auStack_1a28 + (ulong)local_1dfc * 4),8);
    local_fbc = 0x3f;
    auVar2 = vpsllq_avx(local_fb8,ZEXT416(0x3f));
    local_16b8 = auStack_1a28[(ulong)local_1dfc * 4];
    uStack_16b0 = auStack_1a28[(ulong)local_1dfc * 4 + 1];
    local_16bc = 1;
    auVar4._8_8_ = auStack_1a28[(ulong)local_1dfc * 4 + 1];
    auVar4._0_8_ = auStack_1a28[(ulong)local_1dfc * 4];
    local_1358 = vpsrlq_avx(auVar4,ZEXT416(1));
    local_1e48 = auVar2._0_8_;
    uStack_1e40 = auVar2._8_8_;
    local_1368 = local_1e48;
    uStack_1360 = uStack_1e40;
    auVar2 = vpor_avx(local_1358,auVar2);
    *(undefined1 (*) [16])(auStack_1b28 + (ulong)local_1dfc * 0x20) = auVar2;
    local_1e38 = auVar3._0_8_;
    uStack_1e30 = auVar3._8_8_;
    local_1378 = *(undefined8 *)(local_1b38 + (ulong)local_1dfc * 0x20);
    uStack_1370 = *(undefined8 *)(local_1b38 + (ulong)local_1dfc * 0x20 + 8);
    local_1388 = local_1e38;
    uStack_1380 = uStack_1e30;
    auVar2._8_8_ = *(undefined8 *)(local_1b38 + (ulong)local_1dfc * 0x20 + 8);
    auVar2._0_8_ = *(undefined8 *)(local_1b38 + (ulong)local_1dfc * 0x20);
    auVar2 = vpor_avx(auVar2,auVar3);
    *(undefined1 (*) [16])(local_1b38 + (ulong)local_1dfc * 0x20) = auVar2;
    lVar31 = (ulong)local_1dfc * 0x20;
    lVar34 = (ulong)local_1dfc * 0x20;
    lVar35 = (ulong)local_1dfc * 0x20;
    local_c98 = (ulong *)(local_1af8 + lVar31);
    local_ca0 = (ulong *)(local_1af8 + lVar34);
    local_ca8 = (ulong *)(local_1b38 + lVar35);
    uVar7 = *(ulong *)(local_1af8 + lVar34 + 8);
    uVar8 = *(ulong *)(local_1b38 + lVar35 + 8);
    *(ulong *)(local_1af8 + lVar31) =
         *(ulong *)(local_1af8 + lVar34) ^ *(ulong *)(local_1b38 + lVar35);
    *(ulong *)(local_1af8 + lVar31 + 8) = uVar7 ^ uVar8;
    uVar7 = *(ulong *)(auStack_1ae8 + lVar34 + 8);
    uVar8 = *(ulong *)(auStack_1b28 + lVar35 + 8);
    *(ulong *)(auStack_1ae8 + lVar31) =
         *(ulong *)(auStack_1ae8 + lVar34) ^ *(ulong *)(auStack_1b28 + lVar35);
    *(ulong *)(auStack_1ae8 + lVar31 + 8) = uVar7 ^ uVar8;
    uVar32 = (ulong)local_1dfc;
    uVar33 = (ulong)local_1dfc;
    lVar31 = (ulong)local_1dfc * 0x20;
    local_cb0 = local_19b8 + uVar32 * 4;
    local_cb8 = local_19b8 + uVar33 * 4;
    local_cc0 = (ulong *)(local_1af8 + lVar31);
    uVar7 = auStack_19a8[uVar33 * 4 + -1];
    uVar8 = *(ulong *)(local_1af8 + lVar31 + 8);
    local_19b8[uVar32 * 4] = local_19b8[uVar33 * 4] ^ *(ulong *)(local_1af8 + lVar31);
    auStack_19a8[uVar32 * 4 + -1] = uVar7 ^ uVar8;
    uVar7 = auStack_19a8[uVar33 * 4 + 1];
    uVar8 = *(ulong *)(auStack_1ae8 + lVar31 + 8);
    auStack_19a8[uVar32 * 4] = auStack_19a8[uVar33 * 4] ^ *(ulong *)(auStack_1ae8 + lVar31);
    auStack_19a8[uVar32 * 4 + 1] = uVar7 ^ uVar8;
    local_a90 = (ulong *)(in_RDI + (ulong)local_1dfc * 0x20);
    uStack_aa0 = auStack_19a8[(ulong)local_1dfc * 4 + -1];
    local_aa8 = local_19b8[(ulong)local_1dfc * 4];
    *local_a90 = local_19b8[(ulong)local_1dfc * 4];
    local_a90[1] = uStack_aa0;
    lVar31 = in_RDI + (ulong)local_1dfc * 0x20;
    local_ab0 = (ulong *)(lVar31 + 0x10);
    uStack_ac0 = auStack_19a8[(ulong)local_1dfc * 4 + 1];
    local_ac8 = auStack_19a8[(ulong)local_1dfc * 4];
    *local_ab0 = auStack_19a8[(ulong)local_1dfc * 4];
    *(ulong *)(lVar31 + 0x18) = uStack_ac0;
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void mpc_sbox_verify_s128_256(mzd_local_t* out, const mzd_local_t* in, view_t* view,
                                            const rvec_t* rvec, const mzd_local_t* mask_a,
                                            const mzd_local_t* mask_b, const mzd_local_t* mask_c) {
  bitsliced_mm128_256_step_1(SC_VERIFY, mask_a, mask_b, mask_c);

  // a & b
  mpc_mm128_256_and_verify_def(NROLR, NROLR, r0m, x0s, x1s, r2m, mask_c, 0);
  // b & c
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r2m, x1s, x2m, r1s,
                               mask_c, 1);
  // c & a
  mpc_mm128_256_and_verify_def(mm128_shift_left_256, mm128_shift_right_256, r1m, x0s, x2m, r0s,
                               mask_c, 2);

  bitsliced_mm128_256_step_2(SC_VERIFY);
}